

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinVWN_RPA>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps)

{
  double dVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double e;
  double local_30;
  
  if (0 < N) {
    lVar2 = 0;
    do {
      dVar4 = *(double *)((long)rho + lVar2 * 2);
      dVar1 = *(double *)((long)rho + lVar2 * 2 + 8);
      dVar3 = 0.0;
      if (1e-24 < dVar4 + dVar1) {
        dVar3 = 1e-24;
        if (1e-24 <= dVar4) {
          dVar3 = dVar4;
        }
        dVar4 = 1e-24;
        if (1e-24 <= dVar1) {
          dVar4 = dVar1;
        }
        kernel_traits<ExchCXX::BuiltinVWN_RPA>::eval_exc_polar_impl(dVar3,dVar4,&local_30);
        dVar3 = local_30;
      }
      *(double *)((long)eps + lVar2) = dVar3 * scal_fact + *(double *)((long)eps + lVar2);
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)N << 3 != lVar2);
  }
  return;
}

Assistant:

LDA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;

    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], e );
    
    eps[i] += scal_fact * e;

  }

}